

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O3

REF_STATUS
ref_migrate_native_rcb_direction
          (REF_MPI ref_mpi,REF_INT n,REF_DBL *xyz,REF_DBL *transform,REF_INT npart,REF_INT offset,
          REF_INT *owners,REF_INT *locals,REF_MPI global_mpi,REF_INT *part,REF_INT seed,REF_INT dir,
          REF_BOOL twod)

{
  REF_DBL *pRVar1;
  REF_DBL RVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  int iVar6;
  REF_DBL *pRVar7;
  void *pvVar8;
  REF_DBL *pRVar9;
  void *items;
  int iVar10;
  int iVar11;
  undefined8 uVar12;
  long lVar13;
  size_t sVar14;
  undefined4 in_register_00000034;
  REF_DBL *pRVar15;
  char *pcVar16;
  ulong uVar17;
  REF_INT n_00;
  REF_STATUS RVar18;
  double dVar19;
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  REF_BOOL in_stack_fffffffffffffee8;
  REF_INT bal_n1;
  REF_INT bal_n0;
  REF_DBL *local_f0;
  double local_e8;
  undefined8 local_d0;
  ulong local_c8;
  REF_DBL *bal_xyz1;
  REF_INT *bal_owners0;
  void *local_b0;
  void *local_a8;
  void *local_a0;
  REF_DBL *local_98;
  REF_DBL *local_90;
  REF_MPI split_mpi;
  void *local_80;
  REF_LONG total;
  REF_INT *bal_locals1;
  REF_INT *bal_locals0;
  REF_INT *bal_owners1;
  REF_DBL *bal_xyz0;
  REF_DBL value1;
  REF_DBL value0;
  long lVar23;
  
  uVar4 = dir;
  if (npart == 0) {
    return 0;
  }
  if (npart != 1) {
    if (n < 0) {
      pcVar16 = "malloc x of REF_DBL negative";
      uVar12 = 0x1ab;
LAB_0021f368:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             uVar12,"ref_migrate_native_rcb_direction",pcVar16);
      return 1;
    }
    uVar17 = (ulong)(uint)n;
    local_f0 = xyz;
    local_d0 = CONCAT44(in_register_00000034,n);
    pRVar7 = (REF_DBL *)malloc(uVar17 * 8);
    if (pRVar7 == (REF_DBL *)0x0) {
      pcVar16 = "malloc x of REF_DBL NULL";
      uVar12 = 0x1ab;
      goto LAB_0021f3be;
    }
    if (2 < uVar4) {
      uVar4 = ref_migrate_split_dir(ref_mpi,(REF_INT)local_d0,local_f0,transform,&dir);
      if (uVar4 != 0) {
        pcVar16 = "dir";
        uVar12 = 0x1ad;
        goto LAB_0021f77a;
      }
      uVar4 = dir;
      if (2 < (uint)dir) {
        pcVar16 = "3D dir";
        uVar12 = 0x1ae;
        goto LAB_0021f368;
      }
    }
    iVar10 = npart / 2;
    dVar19 = (double)npart * 1e+20;
    if (dVar19 <= -dVar19) {
      dVar19 = -dVar19;
    }
    dVar25 = (double)iVar10;
    dVar21 = dVar25;
    if (npart < 2) {
      dVar21 = -dVar25;
    }
    if (dVar19 <= dVar21) {
      pcVar16 = "ratio";
      RVar18 = 4;
      uVar12 = 0x1af;
      uVar17 = 4;
      goto LAB_0021f595;
    }
    local_e8 = dVar25;
    local_c8 = uVar17;
    local_98 = pRVar7;
    local_90 = transform;
    if ((int)local_d0 != 0) {
      uVar17 = 0;
      pRVar7 = local_f0;
      do {
        uVar5 = ref_matrix_ax(3,local_90,pRVar7,(REF_DBL *)&bal_xyz0);
        if (uVar5 != 0) {
          pcVar16 = "ax";
          uVar12 = 0x1b6;
          goto LAB_0021f601;
        }
        local_98[uVar17] = (REF_DBL)(&bal_xyz0)[uVar4];
        uVar17 = uVar17 + 1;
        pRVar7 = pRVar7 + 3;
      } while (local_c8 != uVar17);
    }
    total = local_c8;
    uVar4 = ref_mpi_allsum(ref_mpi,&total,1,2);
    pRVar7 = local_98;
    if (uVar4 != 0) {
      pcVar16 = "high_pos";
      uVar12 = 0x1bb;
LAB_0021f77a:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             uVar12,"ref_migrate_native_rcb_direction",(ulong)uVar4,pcVar16);
      return uVar4;
    }
    local_e8 = local_e8 / (double)npart;
    dVar19 = ((double)(seed % 3) / 3.0) * local_e8;
    n_00 = (REF_INT)local_d0;
    uVar4 = ref_search_selection(ref_mpi,n_00,local_98,(long)((double)total * dVar19),&value0);
    if (uVar4 != 0) {
      pcVar16 = "target";
      uVar12 = 0x1be;
      goto LAB_0021f77a;
    }
    uVar4 = ref_search_selection
                      (ref_mpi,n_00,pRVar7,(long)((double)total * ((dVar19 - local_e8) + 1.0)),
                       &value1);
    if (uVar4 != 0) {
      pcVar16 = "target";
      uVar12 = 0x1c0;
      goto LAB_0021f77a;
    }
    sVar14 = (ulong)(uint)(n_00 * 3) << 3;
    pvVar8 = malloc(sVar14);
    if (pvVar8 == (void *)0x0) {
      pcVar16 = "malloc xyz0 of REF_DBL NULL";
      uVar12 = 0x1c2;
LAB_0021f3be:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             uVar12,"ref_migrate_native_rcb_direction",pcVar16);
      return 2;
    }
    pRVar9 = (REF_DBL *)malloc(sVar14);
    if (pRVar9 == (REF_DBL *)0x0) {
      pcVar16 = "malloc xyz1 of REF_DBL NULL";
      uVar12 = 0x1c3;
      goto LAB_0021f3be;
    }
    sVar14 = local_c8 * 4;
    local_b0 = pvVar8;
    pvVar8 = malloc(sVar14);
    if (pvVar8 == (void *)0x0) {
      pcVar16 = "malloc owners0 of REF_INT NULL";
      uVar12 = 0x1c4;
      goto LAB_0021f3be;
    }
    items = malloc(sVar14);
    if (items == (void *)0x0) {
      pcVar16 = "malloc owners1 of REF_INT NULL";
      uVar12 = 0x1c5;
      goto LAB_0021f3be;
    }
    local_a0 = malloc(sVar14);
    if (local_a0 == (void *)0x0) {
      pcVar16 = "malloc locals0 of REF_INT NULL";
      uVar12 = 0x1c6;
      goto LAB_0021f3be;
    }
    local_a8 = malloc(sVar14);
    if (local_a8 == (void *)0x0) {
      pcVar16 = "malloc locals1 of REF_INT NULL";
      uVar12 = 0x1c7;
      local_a8 = (void *)0x0;
      goto LAB_0021f3be;
    }
    if ((int)local_d0 == 0) {
      local_e8 = 0.0;
      iVar11 = 0;
    }
    else {
      uVar17 = 0;
      iVar11 = 0;
      local_e8 = 0.0;
      do {
        pRVar15 = (REF_DBL *)((uVar17 & 0x7fffffff8) + (long)local_f0);
        if ((*pRVar7 < value0) || (value1 < *pRVar7)) {
          *(REF_DBL *)((long)local_b0 + (long)(iVar11 * 3) * 8 + 0x10) = pRVar15[2];
          RVar2 = pRVar15[1];
          pRVar1 = (REF_DBL *)((long)local_b0 + (long)(iVar11 * 3) * 8);
          *pRVar1 = *pRVar15;
          pRVar1[1] = RVar2;
          *(REF_INT *)((long)pvVar8 + (long)iVar11 * 4) = *owners;
          *(REF_INT *)((long)local_a0 + (long)iVar11 * 4) = *locals;
          iVar11 = iVar11 + 1;
        }
        else {
          iVar6 = SUB84(local_e8,0);
          pRVar9[(long)(iVar6 * 3) + 2] = pRVar15[2];
          RVar2 = pRVar15[1];
          pRVar9[iVar6 * 3] = *pRVar15;
          (pRVar9 + iVar6 * 3)[1] = RVar2;
          *(REF_INT *)((long)items + (long)iVar6 * 4) = *owners;
          *(REF_INT *)((long)local_a8 + (long)iVar6 * 4) = *locals;
          local_e8 = (double)(ulong)(iVar6 + 1);
        }
        uVar17 = uVar17 + 0x18;
        locals = locals + 1;
        owners = owners + 1;
        pRVar7 = pRVar7 + 1;
      } while (local_c8 * 0x18 != uVar17);
    }
    iVar6 = SUB84(local_e8,0) + iVar11;
    local_f0 = pRVar9;
    local_80 = pvVar8;
    if (iVar6 != (int)local_d0) {
      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x1d8,"ref_migrate_native_rcb_direction","conservation",local_c8,(long)iVar6);
      return 1;
    }
    iVar6 = iVar10 + -1;
    uVar4 = ref_mpi_balance(ref_mpi,3,iVar11,local_b0,0,iVar6,&bal_n0,&bal_xyz0,3);
    if (uVar4 != 0) {
      pcVar16 = "split 0";
      uVar12 = 0x1e0;
      goto LAB_0021f77a;
    }
    uVar4 = ref_mpi_balance(ref_mpi,3,SUB84(local_e8,0),local_f0,iVar10,ref_mpi->n + -1,&bal_n1,
                            &bal_xyz1,3);
    if (uVar4 != 0) {
      pcVar16 = "split 1";
      uVar12 = 0x1e4;
      goto LAB_0021f77a;
    }
    uVar4 = ref_mpi_balance(ref_mpi,1,iVar11,local_80,0,iVar6,&bal_n0,&bal_owners0,1);
    if (uVar4 != 0) {
      pcVar16 = "split owner 0";
      uVar12 = 0x1e8;
      goto LAB_0021f77a;
    }
    uVar4 = ref_mpi_balance(ref_mpi,1,SUB84(local_e8,0),items,iVar10,ref_mpi->n + -1,&bal_n1,
                            &bal_owners1,1);
    if (uVar4 != 0) {
      pcVar16 = "split owner 1";
      uVar12 = 0x1ec;
      goto LAB_0021f77a;
    }
    uVar5 = ref_mpi_balance(ref_mpi,1,iVar11,local_a0,0,iVar6,&bal_n0,&bal_locals0,1);
    if (uVar5 != 0) {
      pcVar16 = "split local 0";
      uVar12 = 0x1f0;
LAB_0021f601:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             uVar12,"ref_migrate_native_rcb_direction",(ulong)uVar5,pcVar16);
      return uVar5;
    }
    uVar5 = ref_mpi_balance(ref_mpi,1,SUB84(local_e8,0),local_a8,iVar10,ref_mpi->n + -1,&bal_n1,
                            &bal_locals1,1);
    if (uVar5 != 0) {
      pcVar16 = "split local 1";
      uVar12 = 500;
      goto LAB_0021f601;
    }
    uVar5 = ref_mpi_front_comm(ref_mpi,&split_mpi,iVar10);
    if (uVar5 != 0) {
      pcVar16 = "split";
      uVar12 = 0x1f6;
      goto LAB_0021f601;
    }
    if (ref_mpi->id < iVar10) {
      uVar4 = ref_migrate_native_rcb_direction
                        (split_mpi,bal_n0,bal_xyz0,local_90,iVar10,offset,
                         (REF_INT *)CONCAT44(bal_owners0._4_4_,(int)bal_owners0),bal_locals0,
                         global_mpi,part,seed,-1,in_stack_fffffffffffffee8);
      if (uVar4 == 0) {
LAB_0021fe4d:
        uVar4 = ref_mpi_join_comm(split_mpi);
        if (uVar4 == 0) {
          uVar4 = ref_mpi_free(split_mpi);
          if (uVar4 == 0) {
            if (bal_locals1 != (REF_INT *)0x0) {
              free(bal_locals1);
            }
            if (bal_locals0 != (REF_INT *)0x0) {
              free(bal_locals0);
            }
            if (bal_owners1 != (REF_INT *)0x0) {
              free(bal_owners1);
            }
            if ((void *)CONCAT44(bal_owners0._4_4_,(int)bal_owners0) != (void *)0x0) {
              free((void *)CONCAT44(bal_owners0._4_4_,(int)bal_owners0));
            }
            if (bal_xyz1 != (REF_DBL *)0x0) {
              free(bal_xyz1);
            }
            if (bal_xyz0 != (REF_DBL *)0x0) {
              free(bal_xyz0);
            }
            free(local_a8);
            free(local_a0);
            free(items);
            free(local_80);
            free(local_f0);
            free(local_b0);
            pRVar7 = local_98;
            goto LAB_0021f708;
          }
          uVar17 = (ulong)uVar4;
          pcVar16 = "new free";
          uVar12 = 0x20c;
        }
        else {
          uVar17 = (ulong)uVar4;
          pcVar16 = "join";
          uVar12 = 0x20b;
        }
      }
      else {
        uVar17 = (ulong)uVar4;
        pcVar16 = "recurse 0";
        uVar12 = 0x203;
      }
    }
    else {
      uVar4 = ref_migrate_native_rcb_direction
                        (split_mpi,bal_n1,bal_xyz1,local_90,npart - iVar10,offset + iVar10,
                         bal_owners1,bal_locals1,global_mpi,part,seed,-1,in_stack_fffffffffffffee8);
      if (uVar4 == 0) goto LAB_0021fe4d;
      uVar17 = (ulong)uVar4;
      pcVar16 = "recurse 1";
      uVar12 = 0x208;
    }
    goto LAB_0021f423;
  }
  if (n < 0) {
    pcVar16 = "malloc my_id of REF_INT negative";
    uVar12 = 0x19d;
    goto LAB_0021f368;
  }
  pRVar7 = (REF_DBL *)malloc((ulong)(uint)n * 4);
  auVar3 = _DAT_00221120;
  if (pRVar7 == (REF_DBL *)0x0) {
    pcVar16 = "malloc my_id of REF_INT NULL";
    uVar12 = 0x19d;
    goto LAB_0021f3be;
  }
  if (n != 0) {
    lVar13 = (ulong)(uint)n - 1;
    auVar20._8_4_ = (int)lVar13;
    auVar20._0_8_ = lVar13;
    auVar20._12_4_ = (int)((ulong)lVar13 >> 0x20);
    lVar13 = 0;
    auVar20 = auVar20 ^ _DAT_00221120;
    auVar22 = _DAT_00227510;
    auVar24 = _DAT_00221110;
    do {
      auVar26 = auVar24 ^ auVar3;
      iVar10 = auVar20._4_4_;
      if ((bool)(~(auVar26._4_4_ == iVar10 && auVar20._0_4_ < auVar26._0_4_ ||
                  iVar10 < auVar26._4_4_) & 1)) {
        *(REF_INT *)((long)pRVar7 + lVar13) = offset;
      }
      if ((auVar26._12_4_ != auVar20._12_4_ || auVar26._8_4_ <= auVar20._8_4_) &&
          auVar26._12_4_ <= auVar20._12_4_) {
        *(REF_INT *)((long)pRVar7 + lVar13 + 4) = offset;
      }
      auVar26 = auVar22 ^ auVar3;
      iVar11 = auVar26._4_4_;
      if (iVar11 <= iVar10 && (iVar11 != iVar10 || auVar26._0_4_ <= auVar20._0_4_)) {
        *(REF_INT *)((long)pRVar7 + lVar13 + 8) = offset;
        *(REF_INT *)((long)pRVar7 + lVar13 + 0xc) = offset;
      }
      lVar23 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 4;
      auVar24._8_8_ = lVar23 + 4;
      lVar23 = auVar22._8_8_;
      auVar22._0_8_ = auVar22._0_8_ + 4;
      auVar22._8_8_ = lVar23 + 4;
      lVar13 = lVar13 + 0x10;
    } while ((ulong)(n + 3U >> 2) << 4 != lVar13);
  }
  uVar4 = ref_mpi_blindsend(global_mpi,owners,pRVar7,1,n,&bal_xyz0,(REF_INT *)&bal_owners0,1);
  if (uVar4 == 0) {
    uVar4 = ref_mpi_blindsend(global_mpi,owners,locals,1,n,&bal_xyz1,(REF_INT *)&bal_owners0,1);
    if (uVar4 == 0) {
      if ((long)(int)bal_owners0 < 1) {
        if (bal_xyz0 != (REF_DBL *)0x0) goto LAB_0021f6f1;
      }
      else {
        lVar13 = 0;
        do {
          part[*(int *)((long)bal_xyz1 + lVar13 * 4)] = *(REF_INT *)((long)bal_xyz0 + lVar13 * 4);
          lVar13 = lVar13 + 1;
        } while ((int)bal_owners0 != lVar13);
LAB_0021f6f1:
        free(bal_xyz0);
      }
      if (bal_xyz1 != (REF_DBL *)0x0) {
        free(bal_xyz1);
      }
LAB_0021f708:
      free(pRVar7);
      return 0;
    }
    uVar17 = (ulong)uVar4;
    pcVar16 = "recv loc";
    uVar12 = 0x1a3;
  }
  else {
    uVar17 = (ulong)uVar4;
    pcVar16 = "recv part";
    uVar12 = 0x1a0;
  }
LAB_0021f423:
  RVar18 = (REF_STATUS)uVar17;
LAB_0021f595:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",uVar12,
         "ref_migrate_native_rcb_direction",uVar17,pcVar16);
  return RVar18;
}

Assistant:

REF_FCN static REF_STATUS ref_migrate_native_rcb_direction(
    REF_MPI ref_mpi, REF_INT n, REF_DBL *xyz, REF_DBL *transform, REF_INT npart,
    REF_INT offset, REF_INT *owners, REF_INT *locals, REF_MPI global_mpi,
    REF_INT *part, REF_INT seed, REF_INT dir, REF_BOOL twod) {
  REF_INT i, j, n0, n1, npart0, npart1, offset0, offset1;
  REF_INT bal_n0, bal_n1;
  REF_DBL *xyz0, *xyz1, *x;
  REF_DBL *bal_xyz0, *bal_xyz1;
  REF_INT *owners0, *owners1;
  REF_INT *bal_owners0, *bal_owners1;
  REF_INT *locals0, *locals1;
  REF_INT *bal_locals0, *bal_locals1;
  REF_DBL ratio, value0, value1;
  REF_LONG position, total;
  REF_MPI split_mpi;
  REF_INT seed_base = 3;
  REF_DBL ratio_shift, ratio0, ratio1;
  REF_BOOL cycle_dir = REF_FALSE;

  if (0 == npart) return REF_SUCCESS;

  if (1 == npart) {
    REF_INT *my_id, *recv_part, *recv_locals, nrecv;
    ref_malloc_init(my_id, n, REF_INT, offset);
    RSS(ref_mpi_blindsend(global_mpi, owners, my_id, 1, n, (void **)&recv_part,
                          &nrecv, REF_INT_TYPE),
        "recv part");
    RSS(ref_mpi_blindsend(global_mpi, owners, locals, 1, n,
                          (void **)&recv_locals, &nrecv, REF_INT_TYPE),
        "recv loc");
    for (i = 0; i < nrecv; i++) part[recv_locals[i]] = recv_part[i];
    ref_free(recv_part);
    ref_free(recv_locals);
    ref_free(my_id);
    return REF_SUCCESS;
  }

  ref_malloc(x, n, REF_DBL);
  if (dir < 0 || 2 < dir)
    RSS(ref_migrate_split_dir(ref_mpi, n, xyz, transform, &dir), "dir");
  RAS(-1 < dir && dir < 3, "3D dir");
  RSS(ref_migrate_split_ratio(npart, &ratio), "ratio");
  ratio_shift = (REF_DBL)(seed % seed_base) / (REF_DBL)seed_base;
  ratio0 = ratio * ratio_shift;
  ratio1 = 1.0 - (ratio - ratio0);

  for (i = 0; i < n; i++) {
    REF_DBL transformed[3];
    RSS(ref_matrix_ax(3, transform, &(xyz[3 * i]), transformed), "ax");
    x[i] = transformed[dir];
  }

  total = (REF_LONG)n;
  RSS(ref_mpi_allsum(ref_mpi, &total, 1, REF_LONG_TYPE), "high_pos");

  position = (REF_LONG)((REF_DBL)total * ratio0);
  RSS(ref_search_selection(ref_mpi, n, x, position, &value0), "target");
  position = (REF_LONG)((REF_DBL)total * ratio1);
  RSS(ref_search_selection(ref_mpi, n, x, position, &value1), "target");

  ref_malloc(xyz0, 3 * n, REF_DBL);
  ref_malloc(xyz1, 3 * n, REF_DBL);
  ref_malloc(owners0, n, REF_INT);
  ref_malloc(owners1, n, REF_INT);
  ref_malloc(locals0, n, REF_INT);
  ref_malloc(locals1, n, REF_INT);

  n0 = 0;
  n1 = 0;
  for (i = 0; i < n; i++) {
    if (x[i] < value0 || value1 < x[i]) {
      for (j = 0; j < 3; j++) xyz0[j + 3 * n0] = xyz[j + 3 * i];
      owners0[n0] = owners[i];
      locals0[n0] = locals[i];
      n0++;
    } else {
      for (j = 0; j < 3; j++) xyz1[j + 3 * n1] = xyz[j + 3 * i];
      owners1[n1] = owners[i];
      locals1[n1] = locals[i];
      n1++;
    }
  }
  REIS(n, n0 + n1, "conservation");
  npart0 = npart / 2;
  npart1 = npart - npart0;
  offset0 = offset;
  offset1 = offset + npart0;

  RSS(ref_mpi_balance(ref_mpi, 3, n0, (void *)xyz0, 0, npart0 - 1, &bal_n0,
                      (void **)(&bal_xyz0), REF_DBL_TYPE),
      "split 0");
  RSS(ref_mpi_balance(ref_mpi, 3, n1, (void *)xyz1, npart0,
                      ref_mpi_n(ref_mpi) - 1, &bal_n1, (void **)(&bal_xyz1),
                      REF_DBL_TYPE),
      "split 1");

  RSS(ref_mpi_balance(ref_mpi, 1, n0, (void *)owners0, 0, npart0 - 1, &bal_n0,
                      (void **)(&bal_owners0), REF_INT_TYPE),
      "split owner 0");
  RSS(ref_mpi_balance(ref_mpi, 1, n1, (void *)owners1, npart0,
                      ref_mpi_n(ref_mpi) - 1, &bal_n1, (void **)(&bal_owners1),
                      REF_INT_TYPE),
      "split owner 1");

  RSS(ref_mpi_balance(ref_mpi, 1, n0, (void *)locals0, 0, npart0 - 1, &bal_n0,
                      (void **)(&bal_locals0), REF_INT_TYPE),
      "split local 0");
  RSS(ref_mpi_balance(ref_mpi, 1, n1, (void *)locals1, npart0,
                      ref_mpi_n(ref_mpi) - 1, &bal_n1, (void **)(&bal_locals1),
                      REF_INT_TYPE),
      "split local 1");

  RSS(ref_mpi_front_comm(ref_mpi, &split_mpi, npart0), "split");

  if (cycle_dir) {
    dir += 1;
    if (dir > 2) dir -= 3;
    if (twod && dir > 1) dir -= 2; /* twod skips Z */
  } else {
    dir = -1; /* direction computed in next recursion */
  }
  if (ref_mpi_rank(ref_mpi) < npart0) {
    RSS(ref_migrate_native_rcb_direction(
            split_mpi, bal_n0, bal_xyz0, transform, npart0, offset0,
            bal_owners0, bal_locals0, global_mpi, part, seed, dir, twod),
        "recurse 0");
  } else {
    RSS(ref_migrate_native_rcb_direction(
            split_mpi, bal_n1, bal_xyz1, transform, npart1, offset1,
            bal_owners1, bal_locals1, global_mpi, part, seed, dir, twod),
        "recurse 1");
  }

  RSS(ref_mpi_join_comm(split_mpi), "join");
  RSS(ref_mpi_free(split_mpi), "new free");

  ref_free(bal_locals1);
  ref_free(bal_locals0);

  ref_free(bal_owners1);
  ref_free(bal_owners0);

  ref_free(bal_xyz1);
  ref_free(bal_xyz0);

  ref_free(locals1);
  ref_free(locals0);

  ref_free(owners1);
  ref_free(owners0);

  ref_free(xyz1);
  ref_free(xyz0);

  ref_free(x);
  return REF_SUCCESS;
}